

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O2

void __thiscall cmLoadedCommand::~cmLoadedCommand(cmLoadedCommand *this)

{
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmLoadedCommand_0057fab8;
  if ((this->info).Destructor != (CM_DESTRUCTOR_FUNCTION)0x0) {
    InstallSignalHandlers((this->info).Name,0);
    (*(this->info).Destructor)(&this->info);
    InstallSignalHandlers((this->info).Name,1);
  }
  free((this->info).Error);
  cmCommand::~cmCommand(&this->super_cmCommand);
  return;
}

Assistant:

cmLoadedCommand::~cmLoadedCommand()
{
  if (this->info.Destructor) {
    cmLoadedCommand::InstallSignalHandlers(info.Name);
    this->info.Destructor(&this->info);
    cmLoadedCommand::InstallSignalHandlers(info.Name, 1);
  }
  if (this->info.Error) {
    free(this->info.Error);
  }
}